

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void __thiscall
ImGuiInputTextCallbackData::DeleteChars(ImGuiInputTextCallbackData *this,int pos,int bytes_count)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  
  cVar1 = (this->Buf + pos)[bytes_count];
  pcVar2 = this->Buf + pos;
  while (cVar1 != '\0') {
    *pcVar2 = cVar1;
    cVar1 = pcVar2[(long)bytes_count + 1];
    pcVar2 = pcVar2 + 1;
  }
  *pcVar2 = '\0';
  iVar3 = this->CursorPos;
  if (iVar3 < bytes_count + pos) {
    if (iVar3 < pos) goto LAB_002173ad;
  }
  else {
    pos = iVar3 - bytes_count;
  }
  iVar3 = pos;
  this->CursorPos = iVar3;
LAB_002173ad:
  this->SelectionEnd = iVar3;
  this->SelectionStart = iVar3;
  this->BufDirty = true;
  this->BufTextLen = this->BufTextLen - bytes_count;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::DeleteChars(int pos, int bytes_count)
{
    IM_ASSERT(pos + bytes_count <= BufTextLen);
    char* dst = Buf + pos;
    const char* src = Buf + pos + bytes_count;
    while (char c = *src++)
        *dst++ = c;
    *dst = '\0';

    if (CursorPos >= pos + bytes_count)
        CursorPos -= bytes_count;
    else if (CursorPos >= pos)
        CursorPos = pos;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen -= bytes_count;
}